

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeGraph.cpp
# Opt level: O0

void __thiscall Assimp::OptimizeGraphProcess::OptimizeGraphProcess(OptimizeGraphProcess *this)

{
  OptimizeGraphProcess *this_local;
  
  BaseProcess::BaseProcess(&this->super_BaseProcess);
  (this->super_BaseProcess)._vptr_BaseProcess = (_func_int **)&PTR__OptimizeGraphProcess_00f3f580;
  this->mScene = (aiScene *)0x0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->locked);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(&this->locked_nodes);
  this->nodes_in = 0;
  this->nodes_out = 0;
  this->count_merged = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->meshes);
  return;
}

Assistant:

OptimizeGraphProcess::OptimizeGraphProcess() :
		mScene(),
		nodes_in(),
		nodes_out(),
		count_merged() {
	// empty
}